

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

string * __thiscall
FIX::UtcTimeStampConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,UtcTimeStampConvertor *this,UtcTimeStamp *value,
          int precision)

{
  int local_8c;
  allocator local_5d;
  int local_5c [3];
  int local_50;
  int fraction;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  char result [27];
  int precision_local;
  UtcTimeStamp *value_local;
  
  result._20_4_ = SUB84(value,0);
  local_5c[1] = 0;
  local_5c[0] = 9;
  unique0x100001f6 = (DateTime *)this;
  result._20_4_ = clamp_of<int>((int *)(result + 0x14),local_5c + 1,local_5c);
  DateTime::getYMD(stack0xffffffffffffffe8,&day,&hour,&minute);
  DateTime::getHMS(stack0xffffffffffffffe8,&second,&fraction,&local_50,local_5c + 2,result._20_4_);
  integer_to_string_padded<int>((char *)&month,4,day,'0');
  integer_to_string_padded<int>((char *)&year,2,hour,'0');
  integer_to_string_padded<int>((char *)((long)&year + 2),2,minute,'0');
  result[0] = '-';
  integer_to_string_padded<int>(result + 1,2,second,'0');
  result[3] = ':';
  integer_to_string_padded<int>(result + 4,2,fraction,'0');
  result[6] = ':';
  integer_to_string_padded<int>(result + 7,2,local_50,'0');
  if (result._20_4_ != 0) {
    result[9] = '.';
    integer_to_string_padded<int>(result + 10,(long)(int)result._20_4_,local_5c[2],'0');
  }
  if (result._20_4_ == 0) {
    local_8c = 0x11;
  }
  else {
    local_8c = result._20_4_ + 0x12;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(char *)&month,(long)local_8c,&local_5d);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d);
  return __return_storage_ptr__;
}

Assistant:

EXCEPT(FieldConvertError) {
    char result[17 + 10]; // Maximum
    int year, month, day, hour, minute, second, fraction;

    precision = clamp_of(precision, 0, 9);

    value.getYMD(year, month, day);
    value.getHMS(hour, minute, second, fraction, precision);

    integer_to_string_padded(result, 4, year);
    integer_to_string_padded(result + 4, 2, month);
    integer_to_string_padded(result + 6, 2, day);
    result[8] = '-';
    integer_to_string_padded(result + 9, 2, hour);
    result[11] = ':';
    integer_to_string_padded(result + 12, 2, minute);
    result[14] = ':';
    integer_to_string_padded(result + 15, 2, second);

    if (precision) {
      result[17] = '.';
      integer_to_string_padded(result + 18, precision, fraction);
    }

    return std::string(result, precision ? (17 + 1 + precision) : 17);
  }